

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O0

void __thiscall arangodb::velocypack::Builder::appendUInt(Builder *this,uint64_t v,uint8_t base)

{
  char in_DL;
  ulong in_RSI;
  Builder *in_RDI;
  uint8_t vSize;
  ValueLength save;
  undefined7 in_stack_ffffffffffffffc8;
  uint8_t in_stack_ffffffffffffffcf;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  char cVar1;
  Builder *in_stack_ffffffffffffffe0;
  ValueLength VVar2;
  ulong local_10;
  
  reserve(in_stack_ffffffffffffffe0,CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  VVar2 = in_RDI->_pos;
  advance(in_RDI,CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  cVar1 = '\0';
  local_10 = in_RSI;
  do {
    cVar1 = cVar1 + '\x01';
    appendByteUnchecked(in_RDI,in_stack_ffffffffffffffcf);
    local_10 = local_10 >> 8;
  } while (local_10 != 0);
  in_RDI->_start[VVar2] = in_DL + cVar1;
  return;
}

Assistant:

void appendUInt(uint64_t v, uint8_t base) {
    reserve(9);
    ValueLength save = _pos;
    advance(1);
    uint8_t vSize = 0;
    do {
      vSize++;
      appendByteUnchecked(static_cast<uint8_t>(v & 0xff));
      v >>= 8;
    } while (v != 0);
    _start[save] = base + vSize;
  }